

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockArraySizeContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  Node *pNVar1;
  TestNode *pTVar2;
  bool bVar3;
  ProgramResourceQueryTestTarget queryTarget;
  string local_50;
  
  bVar3 = false;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&queryTarget,PROGRAMINTERFACE_UNIFORM,2);
  pNVar1 = parentStructure->m_ptr;
  if (pNVar1->m_type == TYPE_INTERFACE_BLOCK) {
    if (*(char *)&pNVar1[1]._vptr_Node == '\x01') {
      bVar3 = ((pNVar1->m_enclosingNode).m_ptr)->m_type != TYPE_ARRAY_ELEMENT;
    }
    else {
      bVar3 = false;
    }
  }
  if ((pNVar1->m_type != TYPE_INTERFACE_BLOCK) || (bVar3)) {
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,context->m_testCtx,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar2);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar2,&queryTarget,2,false);
    generateOpaqueTypeCases(context,parentStructure,(TestCaseGroup *)pTVar2,&queryTarget,2,false);
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,context->m_testCtx,"aggregates","Aggregate types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar2);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,0x1b32ab9);
    generateBufferBackedVariableAggregateTypeCases
              (context,parentStructure,(TestCaseGroup *)pTVar2,queryTarget.interface,
               PROGRAMRESOURCEPROP_ARRAY_SIZE,TYPE_FLOAT,&local_50,3);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,0x1b32ab9);
    generateBufferBackedVariableAggregateTypeCases
              (context,parentStructure,targetGroup,queryTarget.interface,
               PROGRAMRESOURCEPROP_ARRAY_SIZE,TYPE_FLOAT,&local_50,2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void generateUniformBlockArraySizeContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_ARRAY_SIZE);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool								namedNonArrayBlock	= isInterfaceBlock																					&&
																  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
																  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock || namedNonArrayBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 2, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 2, false);
		}

		// aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			generateBufferBackedVariableAggregateTypeCases(context, parentStructure, blockGroup, queryTarget.interface, PROGRAMRESOURCEPROP_ARRAY_SIZE, glu::TYPE_FLOAT, "", 3);
		}
	}
	else
	{
		// aggregates
		generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, queryTarget.interface, PROGRAMRESOURCEPROP_ARRAY_SIZE, glu::TYPE_FLOAT, "", 2);
	}
}